

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_register_error(arg_end *end,void *parent,int error,char *argval)

{
  int iVar1;
  long lVar2;
  
  iVar1 = (end->hdr).maxcount;
  if (end->count < iVar1) {
    end->error[end->count] = error;
    iVar1 = end->count;
    end->parent[iVar1] = parent;
    end->argval[iVar1] = argval;
    end->count = iVar1 + 1;
    return;
  }
  end->error[(long)iVar1 + -1] = 1;
  lVar2 = (long)(end->hdr).maxcount;
  end->parent[lVar2 + -1] = end;
  end->argval[lVar2 + -1] = (char *)0x0;
  return;
}

Assistant:

static void arg_register_error(struct arg_end* end, void* parent, int error, const char* argval) {
    /* printf("arg_register_error(%p,%p,%d,%s)\n",end,parent,error,argval); */
    if (end->count < end->hdr.maxcount) {
        end->error[end->count] = error;
        end->parent[end->count] = parent;
        end->argval[end->count] = argval;
        end->count++;
    } else {
        end->error[end->hdr.maxcount - 1] = ARG_ELIMIT;
        end->parent[end->hdr.maxcount - 1] = end;
        end->argval[end->hdr.maxcount - 1] = NULL;
    }
}